

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
          (EqualIgnoreCaseConstraint *this,string *rhs)

{
  ostream *poVar1;
  string *in_RSI;
  string *in_RDI;
  stringstream iss;
  string local_1d0 [16];
  locale *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  stringstream local_1b0 [16];
  ostream local_1a0 [392];
  locale local_18 [24];
  
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)0x227c3e);
  std::locale::locale(local_18);
  toUpperCopy<std::__cxx11::string>(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::locale::~locale(local_18);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"equal to (case insensitive) ");
  std::operator<<(poVar1,in_RSI);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

EqualIgnoreCaseConstraint(std::string rhs) :
        rhs_(OpenMD::toUpperCopy(rhs)) {
      std::stringstream iss;
      iss << "equal to (case insensitive) " << rhs;
      this->description_ = iss.str();
    }